

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

enable_if_t<std::is_integral<unsigned_long>::value,_uintwide_t<128U,_unsigned_int,_void,_false>_>
math::wide_integer::operator<<(uintwide_t<24U,_unsigned_char,_void,_false> *u,unsigned_long n)

{
  enable_if_t<(std::is_integral<unsigned_long>::value_&&_(_std::is_signed<unsigned_long>::value)),_uintwide_t<128U>_>
  *peVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  unsigned_long local_28;
  unsigned_long n_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *u_local;
  
  local_38 = *(undefined8 *)u;
  uStack_30 = *(undefined8 *)(u[2].values.super_array<unsigned_char,_3UL>.elems + 2);
  local_28 = n;
  n_local = (unsigned_long)u;
  peVar1 = uintwide_t<128u,unsigned_int,void,false>::operator<<=
                     ((uintwide_t<128u,unsigned_int,void,false> *)&local_38,n);
  return (enable_if_t<std::is_integral<unsigned_long>::value,_uintwide_t<128U,_unsigned_int,_void,_false>_>
          )SUB83(*(undefined8 *)peVar1,0);
}

Assistant:

constexpr auto operator<<(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& u, const IntegralType n) -> std::enable_if_t<std::is_integral<IntegralType>::value, uintwide_t<Width2, LimbType, AllocatorType, IsSigned>> { return uintwide_t<Width2, LimbType, AllocatorType, IsSigned>(u).operator<<=(n); }